

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O3

int __thiscall libtorrent::settings_pack::get_int(settings_pack *this,int name)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar4 = 0;
  if ((name & 0xc000U) == 0x4000) {
    ppVar1 = (this->m_ints).
             super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->m_ints).
             super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)ppVar2 - (long)ppVar1;
    if (lVar6 == 0x4f8) {
      piVar5 = &ppVar1[name & 0x3fff].second;
    }
    else {
      uVar8 = lVar6 >> 3;
      while (ppVar3 = ppVar1, 0 < (long)uVar8) {
        uVar7 = uVar8 >> 1;
        uVar8 = ~uVar7 + uVar8;
        ppVar1 = ppVar3 + uVar7 + 1;
        if ((ushort)name <= ppVar3[uVar7].first) {
          ppVar1 = ppVar3;
          uVar8 = uVar7;
        }
      }
      if ((ppVar3 == ppVar2) || ((uint)ppVar3->first != name)) {
        piVar5 = (int *)(&DAT_004e52c8 + ((name & 0x3fffU) << 5));
      }
      else {
        piVar5 = &ppVar3->second;
      }
    }
    iVar4 = *piVar5;
  }
  return iVar4;
}

Assistant:

int settings_pack::get_int(int name) const
	{
		TORRENT_ASSERT_PRECOND((name & type_mask) == int_type_base);
		if ((name & type_mask) != int_type_base) return 0;

		// this is an optimization. If the settings pack is complete,
		// i.e. has every key, we don't need to search, it's just a lookup
		if (m_ints.size() == settings_pack::num_int_settings)
		{
			TORRENT_ASSERT(m_ints[name & index_mask].first == name);
			return m_ints[name & index_mask].second;
		}
		std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
		auto i = std::lower_bound(m_ints.begin(), m_ints.end(), v
				, &compare_first<int>);
		if (i != m_ints.end() && i->first == name) return i->second;

		return int_settings[name & index_mask].default_value;
	}